

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reconinter.h
# Opt level: O0

int is_any_masked_compound_used(BLOCK_SIZE sb_type)

{
  int iVar1;
  BLOCK_SIZE in_DIL;
  int i;
  COMPOUND_TYPE comp_type;
  BLOCK_SIZE in_stack_fffffffffffffff2;
  COMPOUND_TYPE in_stack_fffffffffffffff3;
  int local_c;
  
  iVar1 = is_comp_ref_allowed(in_DIL);
  if (iVar1 != 0) {
    for (local_c = 0; local_c < 4; local_c = local_c + 1) {
      iVar1 = is_masked_compound_type((COMPOUND_TYPE)local_c);
      if ((iVar1 != 0) &&
         (iVar1 = is_interinter_compound_used(in_stack_fffffffffffffff3,in_stack_fffffffffffffff2),
         iVar1 != 0)) {
        return 1;
      }
    }
  }
  return 0;
}

Assistant:

static inline int is_any_masked_compound_used(BLOCK_SIZE sb_type) {
  COMPOUND_TYPE comp_type;
  int i;
  if (!is_comp_ref_allowed(sb_type)) return 0;
  for (i = 0; i < COMPOUND_TYPES; i++) {
    comp_type = (COMPOUND_TYPE)i;
    if (is_masked_compound_type(comp_type) &&
        is_interinter_compound_used(comp_type, sb_type))
      return 1;
  }
  return 0;
}